

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

void Common::refactor(TaskHandle *head)

{
  bool bVar1;
  shared_ptr<Task> *psVar2;
  element_type *peVar3;
  shared_ptr<Task> local_70;
  shared_ptr<Task> local_60;
  undefined1 local_50 [8];
  TaskHandle task;
  undefined1 local_30 [8];
  TaskHandle tail;
  TaskHandle loop_head;
  TaskHandle *head_local;
  
  std::shared_ptr<Task>::shared_ptr
            ((shared_ptr<Task> *)
             &tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,head);
  std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)local_30);
  std::shared_ptr<Task>::shared_ptr
            ((shared_ptr<Task> *)
             &task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(nullptr_t)0x0);
  std::shared_ptr<Task>::operator=
            (head,(shared_ptr<Task> *)
                  &task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Task>::~shared_ptr
            ((shared_ptr<Task> *)
             &task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Task>::shared_ptr
            ((shared_ptr<Task> *)local_50,
             (shared_ptr<Task> *)
             &tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50), bVar1) {
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_50);
    bVar1 = Task::isDealloc(peVar3);
    if (!bVar1) {
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_50);
      bVar1 = Task::isShare(peVar3);
      if (!bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
        if (bVar1) {
          peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )local_30);
          std::shared_ptr<Task>::operator=(&peVar3->next,(shared_ptr<Task> *)local_50);
          peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )local_50);
          std::shared_ptr<Task>::operator=(&peVar3->prev,(shared_ptr<Task> *)local_30);
          std::shared_ptr<Task>::operator=
                    ((shared_ptr<Task> *)local_30,(shared_ptr<Task> *)local_50);
        }
        else {
          psVar2 = std::shared_ptr<Task>::operator=(head,(shared_ptr<Task> *)local_50);
          std::shared_ptr<Task>::operator=((shared_ptr<Task> *)local_30,psVar2);
          std::shared_ptr<Task>::shared_ptr(&local_60,(nullptr_t)0x0);
          peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )local_50);
          std::shared_ptr<Task>::operator=(&peVar3->prev,&local_60);
          std::shared_ptr<Task>::~shared_ptr(&local_60);
        }
      }
    }
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_50);
    std::shared_ptr<Task>::operator=((shared_ptr<Task> *)local_50,&peVar3->next);
  }
  std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)local_50);
  std::shared_ptr<Task>::shared_ptr(&local_70,(nullptr_t)0x0);
  peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  std::shared_ptr<Task>::operator=(&peVar3->next,&local_70);
  std::shared_ptr<Task>::~shared_ptr(&local_70);
  std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)local_30);
  std::shared_ptr<Task>::~shared_ptr
            ((shared_ptr<Task> *)
             &tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void refactor(TaskHandle &head) {
        TaskHandle loop_head = head, tail;
        head = nullptr;
        LOOP(task, loop_head) {
            if (not (task->isDealloc() or task->isShare())) {
                if (not tail) {
                    tail = head = task;
                    task->prev = nullptr;
                } else {
                    tail->next = task;
                    task->prev = tail;
                    tail = task;
                }
            }
        }
        tail->next = nullptr;
    }